

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_service.c
# Opt level: O1

char * mpp_get_mpp_service_name(void)

{
  int iVar1;
  char *pcVar2;
  
  if (mpp_get_mpp_service_name::mpp_service_name != (char *)0x0) {
    return mpp_get_mpp_service_name::mpp_service_name;
  }
  pcVar2 = "/dev/mpp_service";
  iVar1 = access("/dev/mpp_service",6);
  if (iVar1 != 0) {
    pcVar2 = "/dev/mpp-service";
    iVar1 = access("/dev/mpp-service",6);
    if (iVar1 != 0) {
      return mpp_get_mpp_service_name::mpp_service_name;
    }
  }
  mpp_get_mpp_service_name::mpp_service_name = pcVar2;
  return pcVar2;
}

Assistant:

const char *mpp_get_mpp_service_name(void)
{
    static const char *mpp_service_name = NULL;
    static const char *mpp_service_dev[] = {
        "/dev/mpp_service",
        "/dev/mpp-service",
    };

    if (mpp_service_name)
        return mpp_service_name;

    if (!access(mpp_service_dev[0], F_OK | R_OK | W_OK)) {
        mpp_service_name = mpp_service_dev[0];
    } else if (!access(mpp_service_dev[1], F_OK | R_OK | W_OK))
        mpp_service_name = mpp_service_dev[1];

    return mpp_service_name;
}